

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator-=(Roaring64Map *this,Roaring64Map *r)

{
  bool bVar1;
  reference puVar2;
  long in_RSI;
  Roaring64Map *in_RDI;
  unsigned_long value;
  iterator __end2;
  iterator __begin2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  Roaring64Map *in_stack_00000038;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  _Self local_28;
  _Self local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RSI;
  roaring::Roaring64Map::operator-=(in_stack_00000038,&this->plain);
  local_18 = local_10 + 0x38;
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  in_RDI);
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                       ((_Rb_tree_const_iterator<unsigned_long> *)0x116f4c);
    this_00 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
              *puVar2;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              (this_00,(key_type_conflict *)in_RDI);
    std::_Rb_tree_const_iterator<unsigned_long>::operator++
              ((_Rb_tree_const_iterator<unsigned_long> *)this_00);
  }
  return in_RDI;
}

Assistant:

Roaring64Map &operator-=(const Roaring64Map &r) {
        plain -= r.plain;

        for (auto value : r.check)
            check.erase(value);  // Note std::remove() is not for ordered sets

        return *this;
    }